

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StackInterpreter.cpp
# Opt level: O2

Behavior * __thiscall
Lodtalk::StackInterpreter::getLookupClass(StackInterpreter *this,Oop receiver,bool superLookup)

{
  int classIndex;
  Oop OVar1;
  anon_union_8_4_0eb573b0_for_Oop_0 aVar2;
  undefined7 in_register_00000011;
  
  if ((int)CONCAT71(in_register_00000011,superLookup) == 0) {
    classIndex = classIndexOf(receiver);
    aVar2 = (anon_union_8_4_0eb573b0_for_Oop_0)
            VMContext::getClassFromIndex(this->context,classIndex);
    if (aVar2.pointer == (uint8_t *)&NilObject) {
      __assert_fail("!isNil(classOop)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/ronsaldo[P]lodtalk/vm/StackInterpreter.cpp"
                    ,0x231,"Behavior *Lodtalk::StackInterpreter::getLookupClass(Oop, bool)");
    }
  }
  else {
    OVar1 = CompiledMethod::getMethodClass(this->method);
    aVar2 = (anon_union_8_4_0eb573b0_for_Oop_0)
            ((anon_union_8_4_0eb573b0_for_Oop_0 *)((long)OVar1.field_0 + 8))->pointer;
  }
  return (Behavior *)aVar2.pointer;
}

Assistant:

Behavior *getLookupClass(Oop receiver, bool superLookup)
    {
        if (superLookup)
        {
            auto methodClass = method->getMethodClass();
            auto behavior = reinterpret_cast<Behavior*> (methodClass.pointer);
            return behavior->superclass;
        }
        else
        {
            auto classIndex = classIndexOf(receiver);
            auto classOop = context->getClassFromIndex(classIndex);
            assert(!isNil(classOop));

            // Cast the class.
            return reinterpret_cast<Behavior*> (classOop.pointer);
        }
    }